

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

char * get_header_name(c2m_ctx_t c2m_ctx,VARR_token_t *buffer,pos_t err_pos,char **content)

{
  char cVar1;
  short sVar2;
  token_t *pptVar3;
  VARR_char *pVVar4;
  VARR_char *pVVar5;
  pos_t p;
  ulong uVar6;
  char *pcVar7;
  c2m_ctx_t pcVar8;
  char *pcVar9;
  node_t_conflict n;
  token_t ptVar10;
  long *plVar11;
  undefined8 *puVar12;
  void *pvVar13;
  ulong uVar14;
  undefined1 *puVar15;
  size_t sVar16;
  long extraout_RDX;
  c2mir_options *pcVar17;
  c2m_ctx_t pcVar18;
  ulong uVar19;
  c2m_ctx_t pcVar20;
  c2mir_options *pcVar21;
  size_t __size;
  str_t sVar22;
  
  *content = (char *)0x0;
  pcVar17 = (c2mir_options *)buffer;
  pcVar18 = c2m_ctx;
  if (buffer == (VARR_token_t *)0x0) {
LAB_00192242:
    get_header_name_cold_15();
  }
  else {
    uVar14 = buffer->els_num;
    if (uVar14 == 0) goto LAB_00191e37;
    pcVar18 = (c2m_ctx_t)buffer->varr;
    if (pcVar18 != (c2m_ctx_t)0x0) {
      uVar6 = 0;
      pcVar8 = pcVar18;
      do {
        pcVar8 = (c2m_ctx_t)&pcVar8->options;
        pcVar17 = (c2mir_options *)pcVar18->env[0].__jmpbuf[uVar6 - 2];
        if (*(short *)&pcVar17->message_file != 0x20) {
          if ((pcVar17->prepro_only_p != 0x17) || (uVar19 = uVar6 + 1, uVar14 <= uVar19))
          goto LAB_00191e17;
          pcVar7 = *(char **)&pcVar17->debug_p;
          pptVar3 = *(token_t **)&pcVar17->ignore_warnings_p;
          p = *(pos_t *)&pcVar17->debug_p;
          pcVar18 = (c2m_ctx_t)(uVar6 - uVar14);
          pcVar20 = (c2m_ctx_t)0xffffffffffffffff;
          goto LAB_00191dfe;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar14);
      goto LAB_00191e1c;
    }
  }
  get_header_name_cold_13();
LAB_0019224c:
  get_header_name_cold_12();
  goto LAB_00192251;
LAB_00191f68:
  do {
    if ((buffer->varr == (token_t *)0x0) || (buffer->els_num <= uVar19)) {
LAB_0019223d:
      get_header_name_cold_9();
      goto LAB_00192242;
    }
    pcVar9 = buffer->varr[uVar19]->repr;
    cVar1 = *pcVar9;
    while (cVar1 != '\0') {
      pVVar4 = c2m_ctx->symbol_text;
      pcVar8 = (c2m_ctx_t)pVVar4->varr;
      if (pcVar8 == (c2m_ctx_t)0x0) {
LAB_00192238:
        get_header_name_cold_2();
        goto LAB_0019223d;
      }
      sVar16 = pVVar4->els_num;
      uVar14 = sVar16 + 1;
      if (pVVar4->size < uVar14) {
        pcVar21 = (c2mir_options *)((uVar14 >> 1) + uVar14);
        pcVar17 = pcVar21;
        pcVar18 = pcVar8;
        pcVar8 = (c2m_ctx_t)realloc(pcVar8,(size_t)pcVar21);
        pVVar4->varr = (char *)pcVar8;
        pVVar4->size = (size_t)pcVar21;
        sVar16 = pVVar4->els_num;
        uVar14 = sVar16 + 1;
      }
      pVVar4->els_num = uVar14;
      *(char *)((long)pcVar8->env[0].__jmpbuf + (sVar16 - 0x10)) = cVar1;
      pVVar4 = c2m_ctx->temp_string;
      pcVar8 = (c2m_ctx_t)pVVar4->varr;
      if (pcVar8 == (c2m_ctx_t)0x0) {
        get_header_name_cold_1();
        goto LAB_00192238;
      }
      sVar16 = pVVar4->els_num;
      cVar1 = *pcVar9;
      uVar14 = sVar16 + 1;
      if (pVVar4->size < uVar14) {
        pcVar21 = (c2mir_options *)((uVar14 >> 1) + uVar14);
        pcVar17 = pcVar21;
        pcVar18 = pcVar8;
        pcVar8 = (c2m_ctx_t)realloc(pcVar8,(size_t)pcVar21);
        pVVar4->varr = (char *)pcVar8;
        pVVar4->size = (size_t)pcVar21;
        sVar16 = pVVar4->els_num;
        uVar14 = sVar16 + 1;
      }
      pVVar4->els_num = uVar14;
      *(char *)((long)pcVar8->env[0].__jmpbuf + (sVar16 - 0x10)) = cVar1;
      cVar1 = pcVar9[1];
      pcVar9 = pcVar9 + 1;
    }
    uVar19 = uVar19 + 1;
  } while (uVar6 - (long)pcVar20 != uVar19);
LAB_0019205a:
  pVVar4 = c2m_ctx->symbol_text;
  pcVar8 = (c2m_ctx_t)pVVar4->varr;
  if (pcVar8 == (c2m_ctx_t)0x0) goto LAB_00192265;
  sVar16 = pVVar4->els_num;
  uVar14 = sVar16 + 1;
  if (pVVar4->size < uVar14) {
    pcVar21 = (c2mir_options *)((uVar14 >> 1) + uVar14);
    pcVar17 = pcVar21;
    pcVar18 = pcVar8;
    pcVar8 = (c2m_ctx_t)realloc(pcVar8,(size_t)pcVar21);
    pVVar4->varr = (char *)pcVar8;
    pVVar4->size = (size_t)pcVar21;
    sVar16 = pVVar4->els_num;
    uVar14 = sVar16 + 1;
  }
  pVVar4->els_num = uVar14;
  *(undefined1 *)((long)pcVar8->env[0].__jmpbuf + (sVar16 - 0x10)) = 0x3e;
  pVVar4 = c2m_ctx->symbol_text;
  pcVar8 = (c2m_ctx_t)pVVar4->varr;
  if (pcVar8 == (c2m_ctx_t)0x0) goto LAB_0019226a;
  sVar16 = pVVar4->els_num;
  uVar14 = sVar16 + 1;
  if (pVVar4->size < uVar14) {
    pcVar21 = (c2mir_options *)((uVar14 >> 1) + uVar14);
    pcVar17 = pcVar21;
    pcVar18 = pcVar8;
    pcVar8 = (c2m_ctx_t)realloc(pcVar8,(size_t)pcVar21);
    pVVar4->varr = (char *)pcVar8;
    pVVar4->size = (size_t)pcVar21;
    sVar16 = pVVar4->els_num;
    uVar14 = sVar16 + 1;
  }
  pVVar4->els_num = uVar14;
  *(undefined1 *)((long)pcVar8->env[0].__jmpbuf + (sVar16 - 0x10)) = 0;
  pVVar4 = c2m_ctx->temp_string;
  pcVar9 = pVVar4->varr;
  if (pcVar9 == (char *)0x0) goto LAB_0019226f;
  sVar16 = pVVar4->els_num;
  uVar14 = sVar16 + 1;
  if (pVVar4->size < uVar14) {
    __size = (uVar14 >> 1) + uVar14;
    pcVar9 = (char *)realloc(pcVar9,__size);
    pVVar4->varr = pcVar9;
    pVVar4->size = __size;
    sVar16 = pVVar4->els_num;
    uVar14 = sVar16 + 1;
  }
  pVVar4->els_num = uVar14;
  pcVar9[sVar16] = '\0';
  pcVar17 = (c2mir_options *)(uVar6 & 0xffffffff);
  pcVar18 = (c2m_ctx_t)buffer;
  del_tokens(buffer,(int)uVar6,-(int)pcVar20);
  if (c2m_ctx->symbol_text != (VARR_char *)0x0) {
    if (c2m_ctx->temp_string == (VARR_char *)0x0) goto LAB_00192279;
    pcVar9 = c2m_ctx->symbol_text->varr;
    sVar22 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
    n = new_node(c2m_ctx,N_STR);
    add_pos(c2m_ctx,n,p);
    (n->u).s = sVar22;
    sVar22 = uniq_cstr(c2m_ctx,pcVar9);
    pcVar17 = (c2mir_options *)0x30;
    pcVar18 = c2m_ctx;
    ptVar10 = (token_t)reg_malloc(c2m_ctx,0x30);
    *(undefined4 *)ptVar10 = 0x13e;
    (ptVar10->pos).fname = pcVar7;
    *(token_t **)&(ptVar10->pos).lno = pptVar3;
    ptVar10->repr = sVar22.s;
    ptVar10->node_code = N_IGNORE;
    ptVar10->node = n;
    if ((buffer->varr != (token_t *)0x0) && (uVar14 = buffer->els_num, uVar6 < uVar14)) {
      buffer->varr[uVar6] = ptVar10;
      goto LAB_00191e1c;
    }
    goto LAB_00192260;
  }
  goto LAB_00192274;
  while( true ) {
    pcVar20 = (c2m_ctx_t)((long)&pcVar20[-1].gen_ctx + 7);
    pcVar8 = (c2m_ctx_t)(((__jmp_buf_tag *)pcVar8)->__jmpbuf + 1);
    if (pcVar18 == pcVar20) break;
LAB_00191dfe:
    pcVar17 = (c2mir_options *)((__jmp_buf_tag *)pcVar8)->__jmpbuf[0];
    if (pcVar17->prepro_only_p == 0x19) {
      pVVar4 = c2m_ctx->symbol_text;
      if ((pVVar4 == (VARR_char *)0x0) ||
         (pcVar8 = (c2m_ctx_t)pVVar4->varr, pcVar8 == (c2m_ctx_t)0x0)) goto LAB_00192256;
      pVVar4->els_num = 0;
      pVVar5 = c2m_ctx->temp_string;
      if ((pVVar5 == (VARR_char *)0x0) || (pVVar5->varr == (char *)0x0)) goto LAB_0019225b;
      pVVar5->els_num = 0;
      pcVar17 = (c2mir_options *)pVVar4->els_num;
      puVar15 = (undefined1 *)((long)&pcVar17->message_file + 1);
      if ((undefined1 *)pVVar4->size < puVar15) {
        pcVar18 = pcVar8;
        pcVar8 = (c2m_ctx_t)realloc(pcVar8,(size_t)(puVar15 + ((ulong)puVar15 >> 1)));
        pVVar4->varr = (char *)pcVar8;
        pVVar4->size = (size_t)(puVar15 + ((ulong)puVar15 >> 1));
        pcVar17 = (c2mir_options *)pVVar4->els_num;
        puVar15 = (undefined1 *)((long)&pcVar17->message_file + 1);
      }
      pVVar4->els_num = (size_t)puVar15;
      *(undefined1 *)((long)&pcVar17[1].include_dirs_num + (long)(pcVar8->env + -1)) = 0x3c;
      if (uVar6 - (long)pcVar20 <= uVar19) goto LAB_0019205a;
      goto LAB_00191f68;
    }
  }
LAB_00191e17:
  if (uVar14 == 0) {
LAB_00191e37:
    uVar14 = 0;
    uVar6 = 0;
  }
  else {
LAB_00191e1c:
    if (buffer->varr == (token_t *)0x0) goto LAB_0019224c;
    uVar6 = (ulong)(*(short *)*buffer->varr == 0x20);
  }
  pcVar17 = (c2mir_options *)(uVar14 - 1);
  if ((c2mir_options *)uVar6 != pcVar17) {
LAB_00191e88:
    error(c2m_ctx,0x1c1443,err_pos.fname,err_pos._8_8_);
    return (char *)0x0;
  }
  if ((uVar6 < uVar14) && (buffer->varr != (token_t *)0x0)) {
    ptVar10 = buffer->varr[uVar6];
    sVar2 = *(short *)ptVar10;
    if ((sVar2 == 0x102) || (sVar2 == 0x13e)) {
      pcVar7 = get_include_fname(c2m_ctx,ptVar10,content);
      return pcVar7;
    }
    goto LAB_00191e88;
  }
LAB_00192251:
  get_header_name_cold_14();
LAB_00192256:
  get_header_name_cold_11();
LAB_0019225b:
  get_header_name_cold_10();
LAB_00192260:
  get_header_name_cold_3();
LAB_00192265:
  get_header_name_cold_8();
LAB_0019226a:
  get_header_name_cold_7();
LAB_0019226f:
  get_header_name_cold_6();
LAB_00192274:
  get_header_name_cold_5();
LAB_00192279:
  get_header_name_cold_4();
  plVar11 = (long *)malloc(0x30);
  pcVar7 = &DAT_00000018;
  *plVar11 = (long)pcVar18;
  plVar11[1] = (long)pcVar17;
  plVar11[2] = extraout_RDX;
  *(undefined4 *)(plVar11 + 4) = 0;
  plVar11[3] = 0;
  puVar12 = (undefined8 *)malloc(0x18);
  plVar11[5] = (long)puVar12;
  if (puVar12 != (undefined8 *)0x0) {
    *puVar12 = 0;
    puVar12[1] = 0x40;
    pvVar13 = malloc(0x200);
    puVar12[2] = pvVar13;
    return (char *)plVar11;
  }
  mir_varr_error(pcVar7);
}

Assistant:

static const char *get_header_name (c2m_ctx_t c2m_ctx, VARR (token_t) * buffer, pos_t err_pos,
                                    const char **content) {
  size_t i;

  *content = NULL;
  transform_to_header (c2m_ctx, buffer);
  i = 0;
  if (VARR_LENGTH (token_t, buffer) != 0 && VARR_GET (token_t, buffer, 0)->code == ' ') i++;
  if (i != VARR_LENGTH (token_t, buffer) - 1
      || (VARR_GET (token_t, buffer, i)->code != T_STR
          && VARR_GET (token_t, buffer, i)->code != T_HEADER)) {
    error (c2m_ctx, err_pos, "wrong #include");
    return NULL;
  }
  return get_include_fname (c2m_ctx, VARR_GET (token_t, buffer, i), content);
}